

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommylist.c
# Opt level: O2

void tommy_list_sort(tommy_list *list,undefined1 *cmp)

{
  tommy_list ptVar1;
  tommy_node_struct *ptVar2;
  tommy_node *ptVar3;
  ulong uVar4;
  uint uVar5;
  tommy_chain *second;
  tommy_list ptVar6;
  uint uVar7;
  tommy_chain *first;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  tommy_node *tail;
  tommy_chain local_248 [32];
  tommy_chain local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar6 = *list;
  if (ptVar6 != (tommy_list)0x0) {
    ptVar1 = ptVar6->prev;
    uVar7 = 0;
    do {
      local_48.head = ptVar6;
      local_48.tail = ptVar6;
      ptVar2 = ptVar6->next;
      uVar4 = 0;
      second = &local_48;
      uVar5 = uVar7;
      while( true ) {
        first = local_248 + uVar4;
        if ((uVar5 & 1) == 0) break;
        tommy_chain_merge_degenerated(first,second,cmp);
        uVar5 = uVar5 >> 1;
        uVar4 = (ulong)((int)uVar4 + 1);
        second = first;
      }
      ptVar3 = second->tail;
      first->head = second->head;
      local_248[uVar4].tail = ptVar3;
      uVar7 = uVar7 + 1;
      bVar9 = ptVar6 != ptVar1;
      ptVar6 = ptVar2;
    } while (bVar9);
    uVar5 = 0;
    if (uVar7 != 0) {
      for (; (uVar7 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
      }
    }
    uVar4 = (ulong)uVar5;
    uVar7 = uVar7 >> ((byte)uVar5 & 0x1f);
    while (uVar7 != 1) {
      uVar8 = (ulong)((int)uVar4 + 1);
      if ((uVar7 & 2) == 0) {
        ptVar3 = local_248[uVar4].tail;
        local_248[uVar8].head = local_248[uVar4].head;
        local_248[uVar8].tail = ptVar3;
        uVar4 = uVar8;
        uVar7 = uVar7 >> 1;
      }
      else {
        tommy_chain_merge_degenerated(local_248 + uVar8,local_248 + uVar4,cmp);
        uVar4 = uVar8;
        uVar7 = uVar7 >> 1;
      }
    }
    ptVar3 = local_248[uVar4].head;
    ptVar2 = local_248[uVar4].tail;
    ptVar3->prev = ptVar2;
    ptVar2->next = (tommy_node_struct *)0x0;
    *list = ptVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_list_sort(tommy_list* list, tommy_compare_func* cmp)
{
	tommy_chain chain;
	tommy_node* head;

	if (tommy_list_empty(list))
		return;

	head = tommy_list_head(list);

	/* create a chain from the list */
	chain.head = head;
	chain.tail = head->prev;

	tommy_chain_mergesort(&chain, cmp);

	/* restore the list */
	tommy_list_set(list, chain.head, chain.tail);
}